

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_type_sync_read
          (t_rs_generator *this,string *type_var,t_type *ttype,bool is_boxed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  t_map *ptVar3;
  long *plVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var;
  undefined8 *puVar6;
  size_type *psVar7;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])(ttype);
    if ((char)iVar2 != '\0') {
      switch(*(undefined4 *)&(((t_map *)ttype)->super_t_container).cpp_name_._M_dataplus._M_p) {
      case 0:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "cannot read field of type TYPE_VOID from input protocol";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      case 1:
        iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[7])
                          (ttype);
        if ((char)iVar2 == '\0') {
          t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                              local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," = i_prot.read_string()?;",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                              local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = i_prot.read_bytes()?;",0x18)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        break;
      case 2:
        t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = i_prot.read_bool()?;",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case 3:
        t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = i_prot.read_i8()?;",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case 4:
        t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = i_prot.read_i16()?;",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case 5:
        t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = i_prot.read_i32()?;",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case 6:
        t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = i_prot.read_i64()?;",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case 7:
        t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," = OrderedFloat::from(i_prot.read_double()?);",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      default:
switchD_0033bf24_default:
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])
                          (ttype);
        std::operator+(__return_storage_ptr__,"cannot read unsupported type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar2));
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_0033c58e:
        operator_delete(local_90._M_dataplus._M_p);
      }
      return;
    }
    iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[9])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])
                        (ttype);
      if ((((char)iVar2 == '\0') &&
          (iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb]
                   )(ttype), (char)iVar2 == '\0')) &&
         (iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])
                            (ttype), (char)iVar2 == '\0')) {
        iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])
                          (ttype);
        if ((char)iVar2 != '\0') {
          render_map_sync_read(this,(t_map *)ttype,type_var);
          return;
        }
        iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])
                          (ttype);
        if ((char)iVar2 != '\0') {
          render_set_sync_read(this,(t_set *)ttype,type_var);
          return;
        }
        iVar2 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])
                          (ttype);
        if ((char)iVar2 != '\0') {
          render_list_sync_read(this,(t_list *)ttype,type_var);
          return;
        }
        goto switchD_0033bf24_default;
      }
      to_rust_type_abi_cxx11_(&local_70,this,ttype);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90.field_2._8_8_ = plVar4[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_90._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      paVar1 = &local_70.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      if ((is_boxed & 1U) == 0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
      }
      else {
        std::operator+(&local_50,"Box::new(",&local_90);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70.field_2._8_8_ = plVar4[3];
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
      }
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (((is_boxed & 1U) != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->f_gen_,local_70._M_dataplus._M_p,
                          local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(type_var->_M_dataplus)._M_p,type_var->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return;
      }
      goto LAB_0033c58e;
    }
    ptVar3 = (t_map *)t_typedef::get_type((t_typedef *)ttype);
    is_boxed = *(bool *)&((t_map *)ttype)->key_type_;
    ttype = (t_type *)ptVar3;
  } while( true );
}

Assistant:

void t_rs_generator::render_type_sync_read(const string &type_var, t_type *ttype, bool is_boxed) {
  if (ttype->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)ttype;
    switch (tbase_type->get_base()) {
    case t_base_type::TYPE_VOID:
      throw "cannot read field of type TYPE_VOID from input protocol";
    case t_base_type::TYPE_STRING:
      if (tbase_type->is_binary()) {
        f_gen_ << indent() << "let " << type_var << " = i_prot.read_bytes()?;" << endl;
      } else {
        f_gen_ << indent() << "let " << type_var << " = i_prot.read_string()?;" << endl;
      }
      return;
    case t_base_type::TYPE_BOOL:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_bool()?;" << endl;
      return;
    case t_base_type::TYPE_I8:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i8()?;" << endl;
      return;
    case t_base_type::TYPE_I16:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i16()?;" << endl;
      return;
    case t_base_type::TYPE_I32:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i32()?;" << endl;
      return;
    case t_base_type::TYPE_I64:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i64()?;" << endl;
      return;
    case t_base_type::TYPE_DOUBLE:
      f_gen_ << indent() << "let " << type_var << " = OrderedFloat::from(i_prot.read_double()?);" << endl;
      return;
    }
  } else if (ttype->is_typedef()) {
    // FIXME: not a fan of separate `is_boxed` parameter
    // This is problematic because it's an optional parameter, and only comes
    // into play once. The core issue is that I lose an important piece of type
    // information (whether the type is a fwd ref) by unwrapping the typedef'd
    // type and making the recursive call using it. I can't modify or wrap the
    // generated string after the fact because it's written directly into the file,
    // so I have to pass this parameter along. Going with this approach because it
    // seems like the lowest-cost option to easily support recursive types.
    t_typedef* ttypedef = (t_typedef*)ttype;
    render_type_sync_read(type_var, ttypedef->get_type(), ttypedef->is_forward_typedef());
    return;
  } else if (ttype->is_enum() || ttype->is_struct() || ttype->is_xception()) {
    string read_call(to_rust_type(ttype) + "::read_from_in_protocol(i_prot)?");
    read_call = is_boxed ? "Box::new(" + read_call + ")" : read_call;
    f_gen_
      << indent()
      << "let " << type_var << " = " <<  read_call << ";"
      << endl;
    return;
  } else if (ttype->is_map()) {
    render_map_sync_read((t_map *) ttype, type_var);
    return;
  } else if (ttype->is_set()) {
    render_set_sync_read((t_set *) ttype, type_var);
    return;
  } else if (ttype->is_list()) {
    render_list_sync_read((t_list *) ttype, type_var);
    return;
  }

  throw "cannot read unsupported type " + ttype->get_name();
}